

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMP_Next.cpp
# Opt level: O3

void get_nextval(string *t)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  memset(nextval,0x3f,0x194);
  nextval[1] = 0;
  uVar1 = t->_M_string_length;
  if (1 < uVar1) {
    pcVar2 = (t->_M_dataplus)._M_p;
    uVar5 = 0;
    uVar8 = 1;
    uVar3 = 1;
    do {
      lVar9 = (long)(int)uVar5;
      if (((int)uVar5 == 0) || (pcVar2[uVar3] == pcVar2[lVar9])) {
        lVar4 = (long)(int)uVar8;
        uVar5 = lVar9 + 1;
        iVar7 = (int)uVar5;
        if (pcVar2[lVar4 + 1] == pcVar2[lVar9 + 1]) {
          iVar7 = nextval[lVar9 + 1];
        }
        nextval[lVar4 + 1] = iVar7;
        uVar3 = lVar4 + 1;
        uVar8 = uVar3 & 0xffffffff;
      }
      else {
        uVar3 = (ulong)(int)uVar8;
        uVar5 = (ulong)(uint)nextval[lVar9];
      }
    } while (uVar3 < uVar1);
    if (1 < (int)uVar8) {
      lVar9 = 0;
      do {
        pcVar6 = " ";
        if (lVar9 == 0) {
          pcVar6 = "nextval:";
        }
        lVar4 = 1;
        if (lVar9 == 0) {
          lVar4 = 8;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
        lVar4 = std::cout;
        *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) =
             *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) | 0x80;
        *(undefined8 *)(memmove + *(long *)(lVar4 + -0x18)) = 2;
        std::ostream::operator<<((ostream *)&std::cout,nextval[lVar9 + 1]);
        lVar9 = lVar9 + 1;
      } while (uVar8 - 1 != lVar9);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void get_nextval(string t) { //nudt的next
    ms(nextval,INF);
    int i = 1, j = 0;
    nextval[1] = 0;
    while(i < t.length()) {
        if(j==0 || t[i]==t[j]) {
            ++i; ++j;
            nextval[i] = (t[i]==t[j])?nextval[j]:j;
        } else {
            j = nextval[j];
        }
    }
    for(int k = 1; k < i; k++) {
        cout << (k==1?"nextval:":" ") << setiosflags(ios::right) << setw(2) << nextval[k];
    }
    cout << endl;
}